

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set.hpp
# Opt level: O1

bool __thiscall
Lib::Set<Kernel::Variable,_Lib::StlHash>::contains
          (Set<Kernel::Variable,_Lib::StlHash> *this,Variable val)

{
  Cell *pCVar1;
  ulong uVar2;
  Variable VVar3;
  Cell *pCVar4;
  uint code;
  uint uVar5;
  bool bVar6;
  
  VVar3._num = 2;
  if (2 < val._num) {
    VVar3._num = val._num;
  }
  pCVar1 = this->_entries;
  uVar2 = (ulong)VVar3._num % (ulong)(uint)this->_capacity;
  uVar5 = pCVar1[uVar2].code;
  bVar6 = uVar5 != 0;
  if (bVar6) {
    pCVar4 = pCVar1 + uVar2;
    do {
      if ((uVar5 == VVar3._num) && ((pCVar4->value)._num == val._num)) {
        return bVar6;
      }
      pCVar4 = pCVar4 + 1;
      if (pCVar4 == this->_afterLast) {
        pCVar4 = pCVar1;
      }
      uVar5 = pCVar4->code;
      bVar6 = uVar5 != 0;
    } while (bVar6);
  }
  return bVar6;
}

Assistant:

bool contains (Val val) const
  {
    unsigned code = Hash::hash(val);
    if (code < 2) {
      code = 2;
    }
    for (Cell* cell = firstCellForCode(code);
	 ! cell->empty();
	 cell = nextCell(cell)) {
      if (cell->deleted()) {
	continue;
      }
      if (cell->code == code &&
	  Hash::equals(cell->value,val)) {
	return true;
      }
    }
    return false;
  }